

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

int Gia_LutWhereIsPin(Gia_Man_t *p,int iFanout,int iFanin,int *pPinPerm)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  
  if (-1 < iFanout) {
    uVar2 = p->vMapping->nSize;
    if (iFanout < (int)uVar2) {
      piVar4 = p->vMapping->pArray;
      uVar3 = piVar4[(uint)iFanout];
      if ((-1 < (long)(int)uVar3) && (uVar3 < uVar2)) {
        puVar1 = (uint *)(piVar4 + (int)uVar3);
        uVar2 = *puVar1;
        if (0 < (int)uVar2) {
          uVar5 = 0;
          do {
            if (puVar1[(long)pPinPerm[uVar5] + 1] == iFanin) {
              return (int)uVar5;
            }
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        return -1;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_LutWhereIsPin( Gia_Man_t * p, int iFanout, int iFanin, int * pPinPerm )
{
    int i;
    for ( i = 0; i < Gia_ObjLutSize(p, iFanout); i++ )
        if ( Gia_ObjLutFanin(p, iFanout, pPinPerm[i]) == iFanin )
            return i;
    return -1;
}